

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_averages_and_directions.cpp
# Opt level: O0

void compute_avgs_and_dirs_4_comp(partition_info *pi,image_block *blk,partition_metrics *pm)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  long lVar52;
  long in_RDX;
  image_block *in_RSI;
  ushort *in_RDI;
  undefined8 uVar53;
  vfloat4 vVar54;
  vmask4 mask;
  vfloat4 best_sum;
  vfloat4 best_vector;
  vfloat4 prod_wp;
  vfloat4 prod_zp;
  vfloat4 prod_yp;
  vfloat4 prod_xp;
  vmask4 tdm3;
  vmask4 tdm2;
  vmask4 tdm1;
  vmask4 tdm0;
  vfloat4 zero;
  vfloat4 texel_datum;
  uint iwt;
  uint i;
  vfloat4 sum_wp;
  vfloat4 sum_zp;
  vfloat4 sum_yp;
  vfloat4 sum_xp;
  vfloat4 average;
  uint texel_count;
  uint8_t *texel_indexes;
  int partition;
  vfloat4 partition_averages [4];
  int partition_count;
  undefined8 local_16d8;
  undefined8 uStackY_16d0;
  undefined8 local_16c8;
  ulong uStackY_16c0;
  undefined8 local_16b8;
  undefined8 uStackY_16b0;
  undefined8 local_16a8;
  undefined8 uStackY_16a0;
  undefined8 local_1698;
  undefined8 uStackY_1690;
  undefined8 local_1688;
  undefined8 uStackY_1680;
  undefined8 local_1678;
  ulong uStackY_1670;
  undefined8 local_1668;
  undefined8 uStackY_1660;
  undefined8 local_1658;
  ulong uStackY_1650;
  undefined8 local_1648;
  undefined8 uStackY_1640;
  undefined8 local_1638;
  undefined8 uStackY_1630;
  undefined8 local_1628;
  undefined8 uStackY_1620;
  undefined8 local_1618;
  undefined8 uStackY_1610;
  undefined8 local_1608;
  ulong uStackY_1600;
  undefined8 local_15f8;
  undefined8 uStackY_15f0;
  undefined8 local_15e8;
  ulong uStackY_15e0;
  undefined8 local_15d8;
  undefined8 uStackY_15d0;
  undefined8 local_15c8;
  undefined8 uStackY_15c0;
  undefined8 local_15b8;
  undefined8 uStackY_15b0;
  undefined8 local_15a8;
  undefined8 uStackY_15a0;
  undefined8 local_1598;
  ulong uStackY_1590;
  undefined8 local_1588;
  undefined8 uStackY_1580;
  undefined8 local_1578;
  ulong uStackY_1570;
  undefined8 local_1568;
  undefined8 uStackY_1560;
  undefined8 local_1558;
  undefined8 uStackY_1550;
  undefined8 local_1548;
  ulong uStackY_1540;
  undefined8 local_1538;
  undefined8 uStackY_1530;
  undefined8 local_1528;
  undefined8 local_1518;
  undefined8 uStackY_1510;
  undefined8 local_1508;
  undefined8 uStackY_1500;
  uint local_14f0;
  uint local_14ec;
  undefined8 local_14e8;
  undefined8 uStackY_14e0;
  undefined8 local_14d8;
  undefined8 uStackY_14d0;
  undefined8 local_14c8;
  undefined8 uStackY_14c0;
  undefined8 local_14b8;
  undefined8 uStackY_14b0;
  undefined8 local_14a8;
  undefined8 uStackY_14a0;
  uint local_148c;
  ushort *local_1488;
  int local_147c;
  undefined8 local_1478 [8];
  uint local_1434;
  long local_1430;
  image_block *local_1428;
  ushort *local_1420;
  undefined1 local_1418 [16];
  undefined1 local_1408 [16];
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  undefined8 local_13c8;
  undefined8 uStackY_13c0;
  undefined8 local_13b8;
  undefined8 uStackY_13b0;
  undefined1 local_13a8 [16];
  undefined8 local_1398;
  undefined8 uStackY_1390;
  undefined8 local_1388;
  undefined8 uStackY_1380;
  undefined1 local_1378 [16];
  undefined8 local_1368;
  undefined8 uStackY_1360;
  undefined8 local_1358;
  undefined8 uStackY_1350;
  undefined1 local_1348 [16];
  undefined8 local_1338;
  undefined8 uStackY_1330;
  undefined8 local_1328;
  undefined8 uStackY_1320;
  undefined1 local_1318 [16];
  undefined8 local_1308;
  ulong uStackY_1300;
  undefined8 local_12f8;
  undefined8 uStackY_12f0;
  undefined1 local_12e8 [16];
  undefined8 local_12d8;
  ulong uStackY_12d0;
  undefined8 local_12c8;
  undefined8 uStackY_12c0;
  undefined1 local_12b8 [16];
  undefined8 local_12a8;
  ulong uStackY_12a0;
  undefined8 local_1298;
  undefined8 uStackY_1290;
  undefined1 local_1288 [16];
  undefined8 local_1278;
  ulong uStackY_1270;
  undefined8 local_1268;
  undefined8 uStackY_1260;
  undefined1 local_1258 [24];
  undefined8 *local_1240;
  undefined1 local_1238 [16];
  undefined8 local_1228;
  undefined8 uStackY_1220;
  undefined8 local_1218;
  undefined8 uStackY_1210;
  undefined8 local_1208;
  undefined8 uStackY_1200;
  undefined8 *local_11f8;
  undefined8 *local_11f0;
  undefined8 local_11e8;
  undefined8 uStackY_11e0;
  undefined8 local_11d8;
  undefined8 uStackY_11d0;
  undefined8 local_11c8;
  undefined8 uStackY_11c0;
  undefined8 *local_11b8;
  undefined8 *local_11b0;
  undefined8 local_11a8;
  undefined8 uStackY_11a0;
  undefined8 local_1198;
  undefined8 uStackY_1190;
  undefined8 local_1188;
  undefined8 uStackY_1180;
  undefined8 *local_1178;
  undefined8 *local_1170;
  undefined8 local_1168;
  undefined8 uStackY_1160;
  undefined8 local_1158;
  undefined8 uStackY_1150;
  undefined8 local_1148;
  undefined8 uStackY_1140;
  undefined8 *local_1138;
  undefined8 *local_1130;
  undefined8 local_1128;
  undefined8 uStackY_1120;
  undefined8 local_1118;
  undefined8 uStackY_1110;
  undefined8 local_1108;
  undefined8 uStackY_1100;
  undefined1 local_10f8 [16];
  undefined8 local_10e8;
  undefined8 uStackY_10e0;
  undefined8 local_10d8;
  undefined8 uStackY_10d0;
  undefined8 local_10c8;
  undefined8 uStackY_10c0;
  undefined1 local_10b8 [16];
  undefined8 local_10a8;
  undefined8 uStackY_10a0;
  undefined8 local_1098;
  undefined8 uStackY_1090;
  undefined8 local_1088;
  undefined8 uStackY_1080;
  undefined1 local_1078 [16];
  undefined8 local_1068;
  undefined8 uStackY_1060;
  undefined8 local_1058;
  undefined8 uStackY_1050;
  undefined8 local_1048;
  undefined8 uStackY_1040;
  undefined1 local_1038 [16];
  undefined8 local_1028;
  undefined8 uStackY_1020;
  undefined8 local_1018;
  undefined8 uStackY_1010;
  undefined8 local_1008;
  undefined8 uStackY_1000;
  undefined1 local_ff8 [16];
  undefined8 local_fe8;
  undefined8 uStackY_fe0;
  undefined8 local_fd8;
  undefined8 uStackY_fd0;
  undefined8 local_fc8;
  ulong uStackY_fc0;
  undefined1 local_fb8 [16];
  undefined8 local_fa8;
  undefined8 uStackY_fa0;
  undefined8 local_f98;
  undefined8 uStackY_f90;
  undefined8 local_f88;
  ulong uStackY_f80;
  undefined1 local_f78 [16];
  undefined8 local_f68;
  undefined8 uStackY_f60;
  undefined8 local_f58;
  undefined8 uStackY_f50;
  undefined8 local_f48;
  ulong uStackY_f40;
  undefined1 local_f38 [16];
  undefined8 local_f28;
  undefined8 uStackY_f20;
  undefined8 local_f18;
  undefined8 uStackY_f10;
  undefined8 local_f08;
  ulong uStackY_f00;
  undefined1 local_ef8 [24];
  undefined8 *local_ee0;
  undefined1 local_ed8 [24];
  undefined8 *local_ec0;
  undefined1 local_eb8 [24];
  undefined8 *local_ea0;
  undefined1 local_e98 [16];
  undefined8 local_e88;
  undefined8 uStackY_e80;
  undefined8 local_e78;
  undefined8 uStackY_e70;
  undefined8 local_e68;
  undefined8 uStackY_e60;
  undefined8 local_e58;
  undefined8 uStackY_e50;
  undefined8 local_e48;
  undefined8 uStackY_e40;
  undefined8 local_e38;
  undefined8 uStackY_e30;
  undefined1 local_e28 [16];
  undefined8 local_e18;
  undefined8 uStackY_e10;
  undefined8 local_e08;
  undefined8 uStackY_e00;
  undefined8 local_df8;
  undefined8 uStackY_df0;
  undefined8 local_de8;
  undefined8 uStackY_de0;
  undefined8 local_dd8;
  undefined8 uStackY_dd0;
  undefined8 local_dc8;
  undefined8 uStackY_dc0;
  undefined1 local_db8 [16];
  undefined8 local_da8;
  undefined8 uStackY_da0;
  undefined8 local_d98;
  undefined8 uStackY_d90;
  undefined8 local_d88;
  undefined8 uStackY_d80;
  undefined8 local_d78;
  undefined8 uStackY_d70;
  undefined8 local_d68;
  undefined8 uStackY_d60;
  undefined8 local_d58;
  undefined8 uStackY_d50;
  undefined1 local_d48 [16];
  undefined8 local_d38;
  undefined8 uStackY_d30;
  undefined8 local_d28;
  undefined8 uStackY_d20;
  undefined8 local_d18;
  undefined8 uStackY_d10;
  undefined8 local_d08;
  undefined8 uStackY_d00;
  undefined8 local_cf8;
  undefined8 uStackY_cf0;
  undefined8 local_ce8;
  undefined8 uStackY_ce0;
  undefined1 local_cd8 [20];
  float local_cc4;
  undefined1 *local_cc0;
  float local_cb4;
  undefined1 *local_cb0;
  float local_ca4;
  undefined1 *local_ca0;
  float local_c94;
  undefined1 *local_c90;
  ulong local_c88;
  undefined8 uStackY_c80;
  undefined8 local_c78;
  undefined8 uStackY_c70;
  ulong local_c68;
  undefined8 uStackY_c60;
  undefined8 local_c58;
  undefined8 uStackY_c50;
  ulong local_c48;
  undefined8 uStackY_c40;
  undefined8 local_c38;
  undefined8 uStackY_c30;
  ulong local_c28;
  undefined8 uStackY_c20;
  undefined8 local_c18;
  undefined8 uStackY_c10;
  undefined8 local_c08;
  undefined8 uStackY_c00;
  undefined8 local_bf8;
  undefined8 uStackY_bf0;
  undefined1 local_be8 [16];
  undefined8 local_bd8;
  undefined8 uStackY_bd0;
  undefined8 local_bc8;
  undefined8 uStackY_bc0;
  undefined1 local_bb8 [16];
  undefined8 local_ba8;
  undefined8 uStackY_ba0;
  undefined8 local_b98;
  undefined8 uStackY_b90;
  undefined1 local_b88 [16];
  undefined8 local_b78;
  undefined8 uStackY_b70;
  undefined8 local_b68;
  undefined8 uStackY_b60;
  undefined1 local_b58 [16];
  undefined8 local_b48;
  undefined8 uStackY_b40;
  undefined8 local_b38;
  undefined8 uStackY_b30;
  undefined8 local_b28;
  undefined8 uStackY_b20;
  undefined8 local_b18;
  undefined8 uStackY_b10;
  undefined8 local_b08;
  undefined8 uStackY_b00;
  undefined8 local_af8;
  undefined8 uStackY_af0;
  undefined8 local_ae8;
  undefined8 uStackY_ae0;
  undefined8 local_ad8;
  undefined8 uStackY_ad0;
  float local_ac8;
  float fStackY_ac4;
  float fStackY_ac0;
  float fStackY_abc;
  undefined1 *local_ab0;
  float local_aa8;
  float fStackY_aa4;
  float fStackY_aa0;
  float fStackY_a9c;
  undefined1 *local_a90;
  float local_a88;
  float fStackY_a84;
  float fStackY_a80;
  float fStackY_a7c;
  undefined1 *local_a70;
  float local_a68;
  float fStackY_a64;
  float fStackY_a60;
  float fStackY_a5c;
  undefined1 *local_a50;
  undefined4 local_a48;
  undefined4 uStackY_a44;
  undefined4 uStackY_a40;
  undefined4 uStackY_a3c;
  undefined1 *local_a30;
  undefined4 local_a28;
  undefined4 uStackY_a24;
  undefined4 uStackY_a20;
  undefined4 uStackY_a1c;
  undefined1 *local_a10;
  undefined4 local_a08;
  undefined4 uStackY_a04;
  undefined4 uStackY_a00;
  undefined4 uStackY_9fc;
  undefined1 *local_9f0;
  undefined1 local_9e8 [16];
  undefined1 *local_9d0;
  undefined1 local_9c8 [16];
  undefined1 *local_9b0;
  undefined1 local_9a8 [16];
  undefined1 *local_990;
  undefined1 local_988 [16];
  undefined1 *local_970;
  undefined1 local_968 [16];
  undefined1 *local_950;
  undefined1 local_948 [16];
  undefined1 *local_930;
  undefined1 local_928 [16];
  undefined1 *local_910;
  undefined1 local_908 [16];
  undefined1 *local_8f0;
  undefined1 local_8e8 [16];
  undefined1 *local_8d0;
  undefined4 local_8c8;
  undefined4 uStackY_8c4;
  undefined4 uStackY_8c0;
  undefined4 uStackY_8bc;
  undefined1 *local_8b0;
  undefined1 local_8a8 [16];
  undefined1 *local_890;
  undefined8 local_888;
  undefined8 uStackY_880;
  undefined1 *local_870;
  undefined8 local_868;
  undefined8 uStackY_860;
  undefined1 *local_850;
  undefined8 local_848;
  undefined8 uStackY_840;
  undefined1 *local_830;
  undefined8 local_828;
  undefined8 uStackY_820;
  undefined1 *local_810;
  undefined8 local_808;
  ulong uStackY_800;
  undefined1 *local_7f0;
  undefined1 local_7e8 [16];
  undefined1 local_7d8 [16];
  undefined1 local_7c8 [16];
  undefined1 local_7b8 [16];
  undefined1 local_7a8 [16];
  undefined8 local_798;
  undefined8 uStackY_790;
  undefined8 local_788;
  undefined8 uStackY_780;
  undefined8 local_778;
  ulong uStackY_770;
  undefined8 local_768;
  undefined8 uStackY_760;
  undefined8 local_758;
  ulong uStackY_750;
  undefined8 local_748;
  undefined8 uStackY_740;
  undefined8 local_738;
  ulong uStackY_730;
  undefined8 local_728;
  undefined8 uStackY_720;
  undefined8 local_718;
  ulong uStackY_710;
  undefined8 local_708;
  undefined8 uStackY_700;
  undefined8 local_6f8;
  undefined8 uStackY_6f0;
  undefined8 local_6e8;
  undefined8 uStackY_6e0;
  undefined8 local_6d8;
  undefined8 uStackY_6d0;
  undefined8 local_6c8;
  undefined8 uStackY_6c0;
  undefined8 local_6b8;
  undefined8 uStackY_6b0;
  undefined8 local_6a8;
  undefined8 uStackY_6a0;
  undefined1 local_698 [16];
  undefined1 *local_680;
  undefined1 local_678 [16];
  undefined1 *local_660;
  undefined1 local_658 [16];
  undefined1 *local_640;
  undefined1 local_638 [16];
  undefined1 *local_620;
  undefined1 local_618 [16];
  undefined1 *local_600;
  undefined1 local_5f8 [16];
  undefined1 *local_5e0;
  undefined1 local_5d8 [16];
  undefined1 *local_5c0;
  undefined8 local_5b8;
  undefined8 uStackY_5b0;
  undefined8 local_5a8;
  undefined8 uStackY_5a0;
  undefined1 local_598 [16];
  float local_588;
  float fStackY_584;
  float fStackY_580;
  float fStackY_57c;
  undefined1 *local_570;
  undefined8 local_568;
  undefined8 uStackY_560;
  vfloat4 *in_stack_fffffffffffffaa8;
  image_block *in_stack_fffffffffffffab0;
  partition_info *in_stack_fffffffffffffab8;
  undefined1 local_4f8 [16];
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  undefined1 *local_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined1 local_4a8 [16];
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  undefined1 *local_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined1 local_3f8 [16];
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined1 local_3d8 [16];
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined1 local_3b8 [16];
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined1 local_398 [16];
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  ulong uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  ulong uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  ulong uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  ulong uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  ulong local_48;
  undefined8 uStack_40;
  ulong local_38;
  undefined8 uStack_30;
  ulong local_28;
  undefined8 uStack_20;
  ulong local_18;
  undefined8 uStack_10;
  
  local_1434 = (uint)*in_RDI;
  if (local_1434 == 0) {
    __assert_fail("partition_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_averages_and_directions.cpp"
                  ,0x18a,
                  "void compute_avgs_and_dirs_4_comp(const partition_info &, const image_block &, partition_metrics *)"
                 );
  }
  local_1430 = in_RDX;
  local_1428 = in_RSI;
  local_1420 = in_RDI;
  compute_partition_averages_rgba
            (in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  local_147c = 0;
  while( true ) {
    if ((int)local_1434 <= local_147c) {
      return;
    }
    local_1488 = local_1420 + (long)local_147c * 0x6c + 0x80;
    local_148c = (uint)*(byte *)((long)local_1420 + (long)local_147c + 4);
    if (local_148c == 0) break;
    local_14a8 = local_1478[(long)local_147c * 2];
    uStackY_14a0 = local_1478[(long)local_147c * 2 + 1];
    puVar1 = (undefined8 *)(local_1430 + (long)local_147c * 0x20);
    *puVar1 = local_14a8;
    puVar1[1] = uStackY_14a0;
    local_7d8 = ZEXT816(0) << 0x20;
    local_7e8 = local_7d8;
    auVar22 = local_7e8;
    local_7e8._8_8_ = SUB168(ZEXT816(0),4);
    local_870 = local_13d8;
    local_888 = 0;
    local_888 = 0;
    uStackY_880 = local_7e8._8_8_;
    local_14b8 = 0;
    uStackY_14b0 = local_7e8._8_8_;
    local_850 = local_13e8;
    local_868 = 0;
    local_868 = 0;
    uStackY_860 = local_7e8._8_8_;
    local_14c8 = 0;
    uStackY_14c0 = local_7e8._8_8_;
    local_7c8 = local_7d8;
    local_830 = local_13f8;
    local_848 = 0;
    local_848 = 0;
    uStackY_840 = local_7e8._8_8_;
    local_14d8 = 0;
    uStackY_14d0 = local_7e8._8_8_;
    local_7b8 = local_7d8;
    local_810 = local_1408;
    local_828 = 0;
    local_828 = 0;
    uStackY_820 = local_7e8._8_8_;
    local_14e8 = 0;
    uVar53 = local_7e8._8_8_;
    local_7e8 = auVar22;
    for (local_14ec = 0; uStackY_14e0 = uVar53, local_14ec < local_148c; local_14ec = local_14ec + 1
        ) {
      local_14f0 = (uint)*(byte *)((long)local_1488 + (ulong)local_14ec);
      vVar54 = image_block::texel(local_1428,local_14f0);
      local_1528 = vVar54.m._0_8_;
      local_1538 = local_14a8;
      uStackY_1530 = uStackY_14a0;
      local_13b8 = local_1528;
      uStackY_13b0 = uVar53;
      local_13c8 = local_14a8;
      uStackY_13c0 = uStackY_14a0;
      local_788 = local_1528;
      uStackY_780 = uVar53;
      local_798 = local_14a8;
      uStackY_790 = uStackY_14a0;
      auVar17._8_8_ = uVar53;
      auVar17._0_8_ = local_1528;
      auVar16._8_8_ = uStackY_14a0;
      auVar16._0_8_ = local_14a8;
      local_8a8 = vsubps_avx(auVar17,auVar16);
      local_890 = local_13a8;
      auVar26 = local_8a8;
      local_1518 = local_8a8._0_8_;
      uStackY_1510 = local_8a8._8_8_;
      local_1508 = local_8a8._0_8_;
      uVar49 = local_1508;
      uStackY_1500 = local_8a8._8_8_;
      uVar50 = uStackY_1500;
      local_7a8 = ZEXT816(0) << 0x20;
      auVar27 = local_7a8;
      local_7a8._8_8_ = SUB168(ZEXT816(0),4);
      local_7f0 = local_1418;
      local_808 = 0;
      local_808 = 0;
      uStackY_800 = local_7a8._8_8_;
      local_1548 = 0;
      uStackY_1540 = local_7a8._8_8_;
      local_1240 = &local_1508;
      local_1508._0_4_ = local_8a8._0_4_;
      local_8b0 = local_1238;
      local_8c8 = (undefined4)local_1508;
      uStackY_8c4 = (undefined4)local_1508;
      uStackY_8c0 = (undefined4)local_1508;
      uStackY_8bc = (undefined4)local_1508;
      local_1568 = CONCAT44((undefined4)local_1508,(undefined4)local_1508);
      uStackY_1560 = CONCAT44((undefined4)local_1508,(undefined4)local_1508);
      local_1578 = 0;
      uStackY_1570 = local_7a8._8_8_;
      local_1268 = local_1568;
      uStackY_1260 = uStackY_1560;
      local_1278 = 0;
      uStackY_1270 = local_7a8._8_8_;
      local_768 = local_1568;
      uStackY_760 = uStackY_1560;
      local_778 = 0;
      uStackY_770 = local_7a8._8_8_;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = local_7a8._8_8_;
      auVar18._8_8_ = uStackY_1560;
      auVar18._0_8_ = local_1568;
      local_698 = vcmpps_avx(auVar41 << 0x40,auVar18,1);
      local_680 = local_1258;
      auVar28 = local_698;
      local_1558 = local_698._0_8_;
      uStackY_1550 = local_698._8_8_;
      local_1598 = 0;
      uStackY_1590 = local_7a8._8_8_;
      local_15a8 = local_8a8._0_8_;
      uStackY_15a0 = local_8a8._8_8_;
      local_15b8 = local_698._0_8_;
      uStackY_15b0 = local_698._8_8_;
      local_f08 = 0;
      uStackY_f00 = local_7a8._8_8_;
      local_f18 = local_8a8._0_8_;
      uStackY_f10 = local_8a8._8_8_;
      local_f28 = local_698._0_8_;
      uStackY_f20 = local_698._8_8_;
      local_358 = 0;
      uStack_350 = local_7a8._8_8_;
      local_368 = local_8a8._0_8_;
      uStack_360 = local_8a8._8_8_;
      local_378 = local_698._0_8_;
      uStack_370 = local_698._8_8_;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = local_7a8._8_8_;
      local_9e8 = vblendvps_avx(auVar42 << 0x40,local_8a8,local_698);
      local_9d0 = local_ef8;
      auVar22 = local_9e8;
      local_1588 = local_9e8._0_8_;
      uStackY_1580 = local_9e8._8_8_;
      local_1130 = &local_14b8;
      local_1138 = &local_1588;
      uVar4 = local_14b8;
      uVar5 = uStackY_14b0;
      local_1158 = local_14b8;
      uStackY_1150 = uStackY_14b0;
      uVar6 = local_9e8._0_8_;
      uVar7 = local_9e8._8_8_;
      local_1168 = local_9e8._0_8_;
      uStackY_1160 = local_9e8._8_8_;
      local_5a8 = local_14b8;
      uStackY_5a0 = uStackY_14b0;
      local_5b8 = local_9e8._0_8_;
      uStackY_5b0 = local_9e8._8_8_;
      local_408._0_4_ = (float)local_14b8;
      local_408._4_4_ = (float)((ulong)local_14b8 >> 0x20);
      uStack_400._0_4_ = (float)uStackY_14b0;
      uStack_400._4_4_ = (float)((ulong)uStackY_14b0 >> 0x20);
      local_418._0_4_ = local_9e8._0_4_;
      local_418._4_4_ = local_9e8._4_4_;
      uStack_410._0_4_ = local_9e8._8_4_;
      uStack_410._4_4_ = local_9e8._12_4_;
      local_570 = local_598;
      local_588 = (float)local_408 + (float)local_418;
      fStackY_584 = local_408._4_4_ + local_418._4_4_;
      fStackY_580 = (float)uStack_400 + (float)uStack_410;
      fStackY_57c = uStack_400._4_4_ + uStack_410._4_4_;
      local_14b8 = CONCAT44(local_408._4_4_ + local_418._4_4_,(float)local_408 + (float)local_418);
      uStackY_14b0 = CONCAT44(uStack_400._4_4_ + uStack_410._4_4_,
                              (float)uStack_400 + (float)uStack_410);
      local_1148 = local_14b8;
      uStackY_1140 = uStackY_14b0;
      local_ee0 = &local_1508;
      local_1508._4_4_ = local_8a8._4_4_;
      local_9f0 = local_ed8;
      local_a08 = local_1508._4_4_;
      uStackY_a04 = local_1508._4_4_;
      uStackY_a00 = local_1508._4_4_;
      uStackY_9fc = local_1508._4_4_;
      local_15d8 = CONCAT44(local_1508._4_4_,local_1508._4_4_);
      uStackY_15d0 = CONCAT44(local_1508._4_4_,local_1508._4_4_);
      local_15e8 = 0;
      uStackY_15e0 = local_7a8._8_8_;
      local_1298 = local_15d8;
      uStackY_1290 = uStackY_15d0;
      local_12a8 = 0;
      uStackY_12a0 = local_7a8._8_8_;
      local_748 = local_15d8;
      uStackY_740 = uStackY_15d0;
      local_758 = 0;
      uStackY_750 = local_7a8._8_8_;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = local_7a8._8_8_;
      auVar19._8_8_ = uStackY_15d0;
      auVar19._0_8_ = local_15d8;
      local_678 = vcmpps_avx(auVar43 << 0x40,auVar19,1);
      local_660 = local_1288;
      auVar29 = local_678;
      local_15c8 = local_678._0_8_;
      uStackY_15c0 = local_678._8_8_;
      local_1608 = 0;
      uStackY_1600 = local_7a8._8_8_;
      local_1618 = local_8a8._0_8_;
      uStackY_1610 = local_8a8._8_8_;
      local_1628 = local_678._0_8_;
      uStackY_1620 = local_678._8_8_;
      local_f48 = 0;
      uStackY_f40 = local_7a8._8_8_;
      local_f58 = local_8a8._0_8_;
      uStackY_f50 = local_8a8._8_8_;
      local_f68 = local_678._0_8_;
      uStackY_f60 = local_678._8_8_;
      local_328 = 0;
      uStack_320 = local_7a8._8_8_;
      local_338 = local_8a8._0_8_;
      uStack_330 = local_8a8._8_8_;
      local_348 = local_678._0_8_;
      uStack_340 = local_678._8_8_;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = local_7a8._8_8_;
      local_9c8 = vblendvps_avx(auVar44 << 0x40,local_8a8,local_678);
      local_9b0 = local_f38;
      auVar23 = local_9c8;
      local_15f8 = local_9c8._0_8_;
      uStackY_15f0 = local_9c8._8_8_;
      local_1170 = &local_14c8;
      local_1178 = &local_15f8;
      uVar8 = local_14c8;
      uVar9 = uStackY_14c0;
      local_1198 = local_14c8;
      uStackY_1190 = uStackY_14c0;
      uVar10 = local_9c8._0_8_;
      uVar11 = local_9c8._8_8_;
      local_11a8 = local_9c8._0_8_;
      uStackY_11a0 = local_9c8._8_8_;
      local_568 = local_9c8._0_8_;
      uStackY_560 = local_9c8._8_8_;
      local_428._0_4_ = (float)local_14c8;
      local_428._4_4_ = (float)((ulong)local_14c8 >> 0x20);
      uStack_420._0_4_ = (float)uStackY_14c0;
      uStack_420._4_4_ = (float)((ulong)uStackY_14c0 >> 0x20);
      local_438._0_4_ = local_9c8._0_4_;
      local_438._4_4_ = local_9c8._4_4_;
      uStack_430._0_4_ = local_9c8._8_4_;
      uStack_430._4_4_ = local_9c8._12_4_;
      local_14c8 = CONCAT44(local_428._4_4_ + local_438._4_4_,(float)local_428 + (float)local_438);
      uStackY_14c0 = CONCAT44(uStack_420._4_4_ + uStack_430._4_4_,
                              (float)uStack_420 + (float)uStack_430);
      local_1188 = local_14c8;
      uStackY_1180 = uStackY_14c0;
      local_ec0 = &local_1508;
      uStackY_1500._0_4_ = local_8a8._8_4_;
      local_a10 = local_eb8;
      local_a28 = (undefined4)uStackY_1500;
      uStackY_a24 = (undefined4)uStackY_1500;
      uStackY_a20 = (undefined4)uStackY_1500;
      uStackY_a1c = (undefined4)uStackY_1500;
      local_1648 = CONCAT44((undefined4)uStackY_1500,(undefined4)uStackY_1500);
      uStackY_1640 = CONCAT44((undefined4)uStackY_1500,(undefined4)uStackY_1500);
      local_1658 = 0;
      uStackY_1650 = local_7a8._8_8_;
      local_12c8 = local_1648;
      uStackY_12c0 = uStackY_1640;
      local_12d8 = 0;
      uStackY_12d0 = local_7a8._8_8_;
      local_728 = local_1648;
      uStackY_720 = uStackY_1640;
      local_738 = 0;
      uStackY_730 = local_7a8._8_8_;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = local_7a8._8_8_;
      auVar20._8_8_ = uStackY_1640;
      auVar20._0_8_ = local_1648;
      local_658 = vcmpps_avx(auVar45 << 0x40,auVar20,1);
      local_640 = local_12b8;
      auVar30 = local_658;
      local_1638 = local_658._0_8_;
      uStackY_1630 = local_658._8_8_;
      local_1678 = 0;
      uStackY_1670 = local_7a8._8_8_;
      local_1688 = local_8a8._0_8_;
      uStackY_1680 = local_8a8._8_8_;
      local_1698 = local_658._0_8_;
      uStackY_1690 = local_658._8_8_;
      local_f88 = 0;
      uStackY_f80 = local_7a8._8_8_;
      local_f98 = local_8a8._0_8_;
      uStackY_f90 = local_8a8._8_8_;
      local_fa8 = local_658._0_8_;
      uStackY_fa0 = local_658._8_8_;
      local_2f8 = 0;
      uStack_2f0 = local_7a8._8_8_;
      local_308 = local_8a8._0_8_;
      uStack_300 = local_8a8._8_8_;
      local_318 = local_658._0_8_;
      uStack_310 = local_658._8_8_;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = local_7a8._8_8_;
      local_9a8 = vblendvps_avx(auVar46 << 0x40,local_8a8,local_658);
      local_990 = local_f78;
      auVar24 = local_9a8;
      local_1668 = local_9a8._0_8_;
      uStackY_1660 = local_9a8._8_8_;
      local_11b0 = &local_14d8;
      local_11b8 = &local_1668;
      uVar12 = local_14d8;
      uVar13 = uStackY_14d0;
      local_11d8 = local_14d8;
      uStackY_11d0 = uStackY_14d0;
      uVar14 = local_9a8._0_8_;
      uVar15 = local_9a8._8_8_;
      local_11e8 = local_9a8._0_8_;
      uStackY_11e0 = local_9a8._8_8_;
      local_448._0_4_ = (float)local_14d8;
      local_448._4_4_ = (float)((ulong)local_14d8 >> 0x20);
      uStack_440._0_4_ = (float)uStackY_14d0;
      uStack_440._4_4_ = (float)((ulong)uStackY_14d0 >> 0x20);
      local_458._0_4_ = local_9a8._0_4_;
      local_458._4_4_ = local_9a8._4_4_;
      uStack_450._0_4_ = local_9a8._8_4_;
      uStack_450._4_4_ = local_9a8._12_4_;
      local_4d0 = local_4f8;
      local_4e8 = (float)local_448 + (float)local_458;
      fStack_4e4 = local_448._4_4_ + local_458._4_4_;
      fStack_4e0 = (float)uStack_440 + (float)uStack_450;
      fStack_4dc = uStack_440._4_4_ + uStack_450._4_4_;
      local_14d8 = CONCAT44(local_448._4_4_ + local_458._4_4_,(float)local_448 + (float)local_458);
      uStackY_14d0 = CONCAT44(uStack_440._4_4_ + uStack_450._4_4_,
                              (float)uStack_440 + (float)uStack_450);
      local_11c8 = local_14d8;
      uStackY_11c0 = uStackY_14d0;
      local_ea0 = &local_1508;
      uStackY_1500._4_4_ = local_8a8._12_4_;
      local_a30 = local_e98;
      local_a48 = uStackY_1500._4_4_;
      uStackY_a44 = uStackY_1500._4_4_;
      uStackY_a40 = uStackY_1500._4_4_;
      uStackY_a3c = uStackY_1500._4_4_;
      local_16b8 = CONCAT44(uStackY_1500._4_4_,uStackY_1500._4_4_);
      uStackY_16b0 = CONCAT44(uStackY_1500._4_4_,uStackY_1500._4_4_);
      local_16c8 = 0;
      uStackY_16c0 = local_7a8._8_8_;
      local_12f8 = local_16b8;
      uStackY_12f0 = uStackY_16b0;
      local_1308 = 0;
      uStackY_1300 = local_7a8._8_8_;
      local_708 = local_16b8;
      uStackY_700 = uStackY_16b0;
      local_718 = 0;
      uStackY_710 = local_7a8._8_8_;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = local_7a8._8_8_;
      auVar21._8_8_ = uStackY_16b0;
      auVar21._0_8_ = local_16b8;
      local_638 = vcmpps_avx(auVar47 << 0x40,auVar21,1);
      local_620 = local_12e8;
      auVar31 = local_638;
      local_16a8 = local_638._0_8_;
      uStackY_16a0 = local_638._8_8_;
      local_fc8 = 0;
      uStackY_fc0 = local_7a8._8_8_;
      local_fd8 = local_8a8._0_8_;
      uStackY_fd0 = local_8a8._8_8_;
      local_fe8 = local_638._0_8_;
      uStackY_fe0 = local_638._8_8_;
      local_2c8 = 0;
      uStack_2c0 = local_7a8._8_8_;
      local_2d8 = local_8a8._0_8_;
      uStack_2d0 = local_8a8._8_8_;
      local_2e8 = local_638._0_8_;
      uStack_2e0 = local_638._8_8_;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = local_7a8._8_8_;
      local_988 = vblendvps_avx(auVar48 << 0x40,local_8a8,local_638);
      local_970 = local_fb8;
      auVar25 = local_988;
      local_16d8 = local_988._0_8_;
      uStackY_16d0 = local_988._8_8_;
      local_11f0 = &local_14e8;
      local_11f8 = &local_16d8;
      uVar2 = local_14e8;
      local_1218 = local_14e8;
      uStackY_1210 = uStackY_14e0;
      local_1228 = local_988._0_8_;
      uVar3 = local_988._8_8_;
      uStackY_1220 = local_988._8_8_;
      local_4b8 = local_14e8;
      uStack_4b0 = uStackY_14e0;
      local_4c8 = local_988._0_8_;
      uStack_4c0 = local_988._8_8_;
      local_478 = local_988._0_8_;
      uVar51 = local_478;
      local_468._0_4_ = (float)local_14e8;
      local_468._4_4_ = (float)((ulong)local_14e8 >> 0x20);
      uStack_460._0_4_ = (float)uStackY_14e0;
      uStack_460._4_4_ = (float)((ulong)uStackY_14e0 >> 0x20);
      local_478._0_4_ = local_988._0_4_;
      local_478._4_4_ = local_988._4_4_;
      uStack_470._0_4_ = local_988._8_4_;
      uStack_470._4_4_ = local_988._12_4_;
      local_480 = local_4a8;
      local_498 = (float)local_468 + (float)local_478;
      fStack_494 = local_468._4_4_ + local_478._4_4_;
      fStack_490 = (float)uStack_460 + (float)uStack_470;
      fStack_48c = uStack_460._4_4_ + uStack_470._4_4_;
      local_14e8 = CONCAT44(local_468._4_4_ + local_478._4_4_,(float)local_468 + (float)local_478);
      uVar53 = CONCAT44(uStack_460._4_4_ + uStack_470._4_4_,(float)uStack_460 + (float)uStack_470);
      local_1208 = local_14e8;
      uStackY_1200 = uVar53;
      local_1508 = uVar49;
      uStackY_1500 = uVar50;
      local_9e8 = auVar22;
      local_9c8 = auVar23;
      local_9a8 = auVar24;
      local_988 = auVar25;
      local_8a8 = auVar26;
      local_7a8 = auVar27;
      local_698 = auVar28;
      local_678 = auVar29;
      local_658 = auVar30;
      local_638 = auVar31;
      local_478 = uVar51;
      uStack_470 = uVar3;
      local_468 = uVar2;
      uStack_460 = uStackY_14e0;
      local_458 = uVar14;
      uStack_450 = uVar15;
      local_448 = uVar12;
      uStack_440 = uVar13;
      local_438 = uVar10;
      uStack_430 = uVar11;
      local_428 = uVar8;
      uStack_420 = uVar9;
      local_418 = uVar6;
      uStack_410 = uVar7;
      local_408 = uVar4;
      uStack_400 = uVar5;
    }
    local_ce8 = local_14b8;
    uStackY_ce0 = uStackY_14b0;
    local_cf8 = local_14b8;
    uStackY_cf0 = uStackY_14b0;
    local_d18 = local_14b8;
    uStackY_d10 = uStackY_14b0;
    local_d28 = local_14b8;
    uStackY_d20 = uStackY_14b0;
    local_bf8 = local_14b8;
    uStackY_bf0 = uStackY_14b0;
    local_c08 = local_14b8;
    uStackY_c00 = uStackY_14b0;
    local_ad8 = local_14b8;
    uVar7 = local_ad8;
    uStackY_ad0 = uStackY_14b0;
    uVar8 = uStackY_ad0;
    local_ae8 = local_14b8;
    uStackY_ae0 = uStackY_14b0;
    local_ad8._0_4_ = (float)local_14b8;
    local_ad8._4_4_ = (float)((ulong)local_14b8 >> 0x20);
    uStackY_ad0._0_4_ = (float)uStackY_14b0;
    uStackY_ad0._4_4_ = (float)((ulong)uStackY_14b0 >> 0x20);
    local_a68 = (float)local_ad8 * (float)local_ad8;
    fStackY_a64 = local_ad8._4_4_ * local_ad8._4_4_;
    local_a50 = local_be8;
    fStackY_a60 = (float)uStackY_ad0 * (float)uStackY_ad0;
    fStackY_a5c = uStackY_ad0._4_4_ * uStackY_ad0._4_4_;
    local_388 = CONCAT44(fStackY_a64,local_a68);
    uStack_380 = CONCAT44(uStackY_ad0._4_4_ * uStackY_ad0._4_4_,
                          (float)uStackY_ad0 * (float)uStackY_ad0);
    local_d08 = local_388;
    uStackY_d00 = uStack_380;
    local_d38 = local_388;
    uStackY_d30 = uStack_380;
    local_c78 = local_388;
    uStackY_c70 = uStack_380;
    auVar40._8_8_ = uStack_380;
    auVar40._0_8_ = local_388;
    auVar39._8_8_ = uStack_380;
    auVar39._0_8_ = local_388;
    local_398 = vunpckhpd_avx(auVar39,auVar40);
    local_68 = fStackY_a64 + (float)local_398._4_4_;
    local_168 = local_a68 + (float)local_398._0_4_ + local_68;
    local_58._4_4_ = 0;
    local_58._0_4_ = local_168;
    local_c88 = local_58._0_8_;
    uStackY_c80 = 0;
    local_18 = local_58._0_8_;
    uStack_10 = 0;
    local_cc0 = local_cd8;
    local_cc4 = local_168;
    local_268 = CONCAT44(local_168,local_168);
    uStack_260 = CONCAT44(local_168,local_168);
    local_d58 = local_14c8;
    uStackY_d50 = uStackY_14c0;
    local_d68 = local_14c8;
    uStackY_d60 = uStackY_14c0;
    local_d88 = local_14c8;
    uStackY_d80 = uStackY_14c0;
    local_d98 = local_14c8;
    uStackY_d90 = uStackY_14c0;
    local_bc8 = local_14c8;
    uStackY_bc0 = uStackY_14c0;
    local_bd8 = local_14c8;
    uStackY_bd0 = uStackY_14c0;
    local_af8 = local_14c8;
    uVar5 = local_af8;
    uStackY_af0 = uStackY_14c0;
    uVar6 = uStackY_af0;
    local_b08 = local_14c8;
    uStackY_b00 = uStackY_14c0;
    local_af8._0_4_ = (float)local_14c8;
    local_af8._4_4_ = (float)((ulong)local_14c8 >> 0x20);
    uStackY_af0._0_4_ = (float)uStackY_14c0;
    uStackY_af0._4_4_ = (float)((ulong)uStackY_14c0 >> 0x20);
    local_a88 = (float)local_af8 * (float)local_af8;
    fStackY_a84 = local_af8._4_4_ * local_af8._4_4_;
    local_a70 = local_bb8;
    fStackY_a80 = (float)uStackY_af0 * (float)uStackY_af0;
    fStackY_a7c = uStackY_af0._4_4_ * uStackY_af0._4_4_;
    local_3a8 = CONCAT44(fStackY_a84,local_a88);
    uStack_3a0 = CONCAT44(uStackY_af0._4_4_ * uStackY_af0._4_4_,
                          (float)uStackY_af0 * (float)uStackY_af0);
    local_d78 = local_3a8;
    uStackY_d70 = uStack_3a0;
    local_da8 = local_3a8;
    uStackY_da0 = uStack_3a0;
    local_c58 = local_3a8;
    uStackY_c50 = uStack_3a0;
    auVar38._8_8_ = uStack_3a0;
    auVar38._0_8_ = local_3a8;
    auVar37._8_8_ = uStack_3a0;
    auVar37._0_8_ = local_3a8;
    local_3b8 = vunpckhpd_avx(auVar37,auVar38);
    local_88 = fStackY_a84 + (float)local_3b8._4_4_;
    local_188 = local_a88 + (float)local_3b8._0_4_ + local_88;
    local_78._4_4_ = 0;
    local_78._0_4_ = local_188;
    local_c68 = local_78._0_8_;
    uStackY_c60 = 0;
    local_28 = local_78._0_8_;
    uStack_20 = 0;
    local_cb0 = local_d48;
    local_cb4 = local_188;
    local_278 = CONCAT44(local_188,local_188);
    uStack_270 = CONCAT44(local_188,local_188);
    local_dc8 = local_14d8;
    uStackY_dc0 = uStackY_14d0;
    local_dd8 = local_14d8;
    uStackY_dd0 = uStackY_14d0;
    local_df8 = local_14d8;
    uStackY_df0 = uStackY_14d0;
    local_e08 = local_14d8;
    uStackY_e00 = uStackY_14d0;
    local_b98 = local_14d8;
    uStackY_b90 = uStackY_14d0;
    local_ba8 = local_14d8;
    uStackY_ba0 = uStackY_14d0;
    local_b18 = local_14d8;
    uVar3 = local_b18;
    uStackY_b10 = uStackY_14d0;
    uVar4 = uStackY_b10;
    local_b28 = local_14d8;
    uStackY_b20 = uStackY_14d0;
    local_b18._0_4_ = (float)local_14d8;
    local_b18._4_4_ = (float)((ulong)local_14d8 >> 0x20);
    uStackY_b10._0_4_ = (float)uStackY_14d0;
    uStackY_b10._4_4_ = (float)((ulong)uStackY_14d0 >> 0x20);
    local_aa8 = (float)local_b18 * (float)local_b18;
    fStackY_aa4 = local_b18._4_4_ * local_b18._4_4_;
    local_a90 = local_b88;
    fStackY_aa0 = (float)uStackY_b10 * (float)uStackY_b10;
    fStackY_a9c = uStackY_b10._4_4_ * uStackY_b10._4_4_;
    local_3c8 = CONCAT44(fStackY_aa4,local_aa8);
    uStack_3c0 = CONCAT44(uStackY_b10._4_4_ * uStackY_b10._4_4_,
                          (float)uStackY_b10 * (float)uStackY_b10);
    local_de8 = local_3c8;
    uStackY_de0 = uStack_3c0;
    local_e18 = local_3c8;
    uStackY_e10 = uStack_3c0;
    local_c38 = local_3c8;
    uStackY_c30 = uStack_3c0;
    auVar36._8_8_ = uStack_3c0;
    auVar36._0_8_ = local_3c8;
    auVar35._8_8_ = uStack_3c0;
    auVar35._0_8_ = local_3c8;
    local_3d8 = vunpckhpd_avx(auVar35,auVar36);
    local_a8 = fStackY_aa4 + (float)local_3d8._4_4_;
    local_1a8 = local_aa8 + (float)local_3d8._0_4_ + local_a8;
    local_98._4_4_ = 0;
    local_98._0_4_ = local_1a8;
    local_c48 = local_98._0_8_;
    uStackY_c40 = 0;
    local_38 = local_98._0_8_;
    uStack_30 = 0;
    local_ca0 = local_db8;
    local_ca4 = local_1a8;
    local_218 = CONCAT44(local_1a8,local_1a8);
    uStack_210 = CONCAT44(local_1a8,local_1a8);
    local_e38 = local_14e8;
    uStackY_e30 = uVar53;
    local_e48 = local_14e8;
    uStackY_e40 = uVar53;
    local_e68 = local_14e8;
    uStackY_e60 = uVar53;
    local_e78 = local_14e8;
    uStackY_e70 = uVar53;
    local_b68 = local_14e8;
    uStackY_b60 = uVar53;
    local_b78 = local_14e8;
    uStackY_b70 = uVar53;
    local_b38 = local_14e8;
    uVar2 = local_b38;
    uStackY_b30 = uVar53;
    uVar53 = uStackY_b30;
    local_b48 = local_14e8;
    uStackY_b40 = uVar53;
    local_b38._0_4_ = (float)local_14e8;
    local_b38._4_4_ = (float)((ulong)local_14e8 >> 0x20);
    uStackY_b30._0_4_ = (float)uVar53;
    uStackY_b30._4_4_ = (float)((ulong)uVar53 >> 0x20);
    local_ac8 = (float)local_b38 * (float)local_b38;
    fStackY_ac4 = local_b38._4_4_ * local_b38._4_4_;
    local_ab0 = local_b58;
    fStackY_ac0 = (float)uStackY_b30 * (float)uStackY_b30;
    fStackY_abc = uStackY_b30._4_4_ * uStackY_b30._4_4_;
    local_3e8 = CONCAT44(fStackY_ac4,local_ac8);
    uStack_3e0 = CONCAT44(uStackY_b30._4_4_ * uStackY_b30._4_4_,
                          (float)uStackY_b30 * (float)uStackY_b30);
    local_e58 = local_3e8;
    uStackY_e50 = uStack_3e0;
    local_e88 = local_3e8;
    uStackY_e80 = uStack_3e0;
    local_c18 = local_3e8;
    uStackY_c10 = uStack_3e0;
    auVar34._8_8_ = uStack_3e0;
    auVar34._0_8_ = local_3e8;
    auVar33._8_8_ = uStack_3e0;
    auVar33._0_8_ = local_3e8;
    local_3f8 = vunpckhpd_avx(auVar33,auVar34);
    local_c8 = fStackY_ac4 + (float)local_3f8._4_4_;
    local_1c8 = local_ac8 + (float)local_3f8._0_4_ + local_c8;
    local_b8._4_4_ = 0;
    local_b8._0_4_ = local_1c8;
    local_c28 = local_b8._0_8_;
    uStackY_c20 = 0;
    local_48 = local_b8._0_8_;
    uStack_40 = 0;
    local_c90 = local_e28;
    local_c94 = local_1c8;
    local_1388 = CONCAT44(local_1c8,local_1c8);
    uStackY_1380 = CONCAT44(local_1c8,local_1c8);
    local_1328 = local_278;
    uStackY_1320 = uStack_270;
    local_1338 = local_268;
    uStackY_1330 = uStack_260;
    local_6e8 = local_278;
    uStackY_6e0 = uStack_270;
    local_6f8 = local_268;
    uStackY_6f0 = uStack_260;
    auVar22._8_8_ = uStack_260;
    auVar22._0_8_ = local_268;
    auVar23._8_8_ = uStack_270;
    auVar23._0_8_ = local_278;
    local_618 = vcmpps_avx(auVar22,auVar23,1);
    local_600 = local_1318;
    auVar33 = local_618;
    local_1008 = local_14b8;
    uStackY_1000 = uStackY_14b0;
    local_1018 = local_14c8;
    uStackY_1010 = uStackY_14c0;
    local_1028 = local_618._0_8_;
    uStackY_1020 = local_618._8_8_;
    local_298 = local_14b8;
    uStack_290 = uStackY_14b0;
    local_2a8 = local_14c8;
    uStack_2a0 = uStackY_14c0;
    local_2b8 = local_618._0_8_;
    uStack_2b0 = local_618._8_8_;
    auVar27._8_8_ = uStackY_14b0;
    auVar27._0_8_ = local_14b8;
    auVar26._8_8_ = uStackY_14c0;
    auVar26._0_8_ = local_14c8;
    local_968 = vblendvps_avx(auVar27,auVar26,local_618);
    local_950 = local_ff8;
    auVar22 = local_968;
    local_1048 = local_268;
    uStackY_1040 = uStack_260;
    local_1058 = local_278;
    uStackY_1050 = uStack_270;
    local_1068 = local_618._0_8_;
    uStackY_1060 = local_618._8_8_;
    local_288 = local_618._0_8_;
    uStack_280 = local_618._8_8_;
    auVar29._8_8_ = uStack_260;
    auVar29._0_8_ = local_268;
    auVar28._8_8_ = uStack_270;
    auVar28._0_8_ = local_278;
    local_948 = vblendvps_avx(auVar29,auVar28,local_618);
    local_930 = local_1038;
    auVar23 = local_948;
    local_1358 = local_218;
    uStackY_1350 = uStack_210;
    local_1368 = local_948._0_8_;
    uStackY_1360 = local_948._8_8_;
    local_6c8 = local_218;
    uStackY_6c0 = uStack_210;
    local_6d8 = local_948._0_8_;
    uStackY_6d0 = local_948._8_8_;
    auVar24._8_8_ = uStack_210;
    auVar24._0_8_ = local_218;
    local_5f8 = vcmpps_avx(local_948,auVar24,1);
    local_5e0 = local_1348;
    auVar27 = local_5f8;
    local_1088 = local_968._0_8_;
    uStackY_1080 = local_968._8_8_;
    local_1098 = local_14d8;
    uStackY_1090 = uStackY_14d0;
    local_10a8 = local_5f8._0_8_;
    uStackY_10a0 = local_5f8._8_8_;
    local_238 = local_968._0_8_;
    uStack_230 = local_968._8_8_;
    local_248 = local_14d8;
    uStack_240 = uStackY_14d0;
    local_258 = local_5f8._0_8_;
    uStack_250 = local_5f8._8_8_;
    auVar30._8_8_ = uStackY_14d0;
    auVar30._0_8_ = local_14d8;
    local_928 = vblendvps_avx(local_968,auVar30,local_5f8);
    local_910 = local_1078;
    auVar24 = local_928;
    local_10c8 = local_948._0_8_;
    uStackY_10c0 = local_948._8_8_;
    local_10d8 = local_218;
    uStackY_10d0 = uStack_210;
    local_10e8 = local_5f8._0_8_;
    uStackY_10e0 = local_5f8._8_8_;
    local_208 = local_948._0_8_;
    uStack_200 = local_948._8_8_;
    local_228 = local_5f8._0_8_;
    uStack_220 = local_5f8._8_8_;
    auVar31._8_8_ = uStack_210;
    auVar31._0_8_ = local_218;
    local_908 = vblendvps_avx(local_948,auVar31,local_5f8);
    local_8f0 = local_10b8;
    auVar26 = local_908;
    local_1398 = local_908._0_8_;
    uStackY_1390 = local_908._8_8_;
    local_6a8 = local_1388;
    uStackY_6a0 = uStackY_1380;
    local_6b8 = local_908._0_8_;
    uStackY_6b0 = local_908._8_8_;
    auVar25._8_8_ = uStackY_1380;
    auVar25._0_8_ = local_1388;
    local_5d8 = vcmpps_avx(local_908,auVar25,1);
    local_5c0 = local_1378;
    auVar28 = local_5d8;
    local_1108 = local_928._0_8_;
    uStackY_1100 = local_928._8_8_;
    local_1118 = local_14e8;
    uStackY_1110 = uVar53;
    local_1128 = local_5d8._0_8_;
    uStackY_1120 = local_5d8._8_8_;
    local_1d8 = local_928._0_8_;
    uStack_1d0 = local_928._8_8_;
    local_1e8 = local_14e8;
    local_1f8 = local_5d8._0_8_;
    uStack_1f0 = local_5d8._8_8_;
    auVar32._8_8_ = uVar53;
    auVar32._0_8_ = local_14e8;
    local_8e8 = vblendvps_avx(local_928,auVar32,local_5d8);
    local_8d0 = local_10f8;
    auVar25 = local_8e8;
    lVar52 = local_1430 + (long)local_147c * 0x20;
    *(undefined8 *)(lVar52 + 0x10) = local_8e8._0_8_;
    *(undefined8 *)(lVar52 + 0x18) = local_8e8._8_8_;
    local_147c = local_147c + 1;
    local_b38 = uVar2;
    uStackY_b30 = uVar53;
    local_b18 = uVar3;
    uStackY_b10 = uVar4;
    local_af8 = uVar5;
    uStackY_af0 = uVar6;
    local_ad8 = uVar7;
    uStackY_ad0 = uVar8;
    local_968 = auVar22;
    local_948 = auVar23;
    local_928 = auVar24;
    local_908 = auVar26;
    local_8e8 = auVar25;
    local_618 = auVar33;
    local_5f8 = auVar27;
    local_5d8 = auVar28;
    uStack_1e0 = uVar53;
    fStack_1c4 = local_1c8;
    fStack_1c0 = local_1c8;
    fStack_1bc = local_1c8;
    local_1ac = local_1c8;
    fStack_1a4 = local_1a8;
    fStack_1a0 = local_1a8;
    fStack_19c = local_1a8;
    local_18c = local_1a8;
    fStack_184 = local_188;
    fStack_180 = local_188;
    fStack_17c = local_188;
    local_16c = local_188;
    fStack_164 = local_168;
    fStack_160 = local_168;
    fStack_15c = local_168;
    local_14c = local_168;
    local_148 = local_3e8;
    uStack_140 = uStack_3e0;
    local_138 = local_3e8;
    uStack_130 = uStack_3e0;
    local_128 = local_3c8;
    uStack_120 = uStack_3c0;
    local_118 = local_3c8;
    uStack_110 = uStack_3c0;
    local_108 = local_3a8;
    uStack_100 = uStack_3a0;
    local_f8 = local_3a8;
    uStack_f0 = uStack_3a0;
    local_e8 = local_388;
    uStack_e0 = uStack_380;
    local_d8 = local_388;
    uStack_d0 = uStack_380;
    fStack_c4 = local_c8;
    fStack_c0 = local_c8;
    fStack_bc = local_c8;
    local_b8 = ZEXT416((uint)local_1c8);
    fStack_a4 = local_a8;
    fStack_a0 = local_a8;
    fStack_9c = local_a8;
    local_98 = ZEXT416((uint)local_1a8);
    fStack_84 = local_88;
    fStack_80 = local_88;
    fStack_7c = local_88;
    local_78 = ZEXT416((uint)local_188);
    fStack_64 = local_68;
    fStack_60 = local_68;
    fStack_5c = local_68;
    local_58 = ZEXT416((uint)local_168);
  }
  __assert_fail("texel_count > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_averages_and_directions.cpp"
                ,0x194,
                "void compute_avgs_and_dirs_4_comp(const partition_info &, const image_block &, partition_metrics *)"
               );
}

Assistant:

void compute_avgs_and_dirs_4_comp(
	const partition_info& pi,
	const image_block& blk,
	partition_metrics pm[BLOCK_MAX_PARTITIONS]
) {
	int partition_count = pi.partition_count;
	promise(partition_count > 0);

	// Pre-compute partition_averages
	vfloat4 partition_averages[BLOCK_MAX_PARTITIONS];
	compute_partition_averages_rgba(pi, blk, partition_averages);

	for (int partition = 0; partition < partition_count; partition++)
	{
		const uint8_t *texel_indexes = pi.texels_of_partition[partition];
		unsigned int texel_count = pi.partition_texel_count[partition];
		promise(texel_count > 0);

		vfloat4 average = partition_averages[partition];
		pm[partition].avg = average;

		vfloat4 sum_xp = vfloat4::zero();
		vfloat4 sum_yp = vfloat4::zero();
		vfloat4 sum_zp = vfloat4::zero();
		vfloat4 sum_wp = vfloat4::zero();

		for (unsigned int i = 0; i < texel_count; i++)
		{
			unsigned int iwt = texel_indexes[i];
			vfloat4 texel_datum = blk.texel(iwt);
			texel_datum = texel_datum - average;

			vfloat4 zero = vfloat4::zero();

			vmask4 tdm0 = texel_datum.swz<0,0,0,0>() > zero;
			sum_xp += select(zero, texel_datum, tdm0);

			vmask4 tdm1 = texel_datum.swz<1,1,1,1>() > zero;
			sum_yp += select(zero, texel_datum, tdm1);

			vmask4 tdm2 = texel_datum.swz<2,2,2,2>() > zero;
			sum_zp += select(zero, texel_datum, tdm2);

			vmask4 tdm3 = texel_datum.swz<3,3,3,3>() > zero;
			sum_wp += select(zero, texel_datum, tdm3);
		}

		vfloat4 prod_xp = dot(sum_xp, sum_xp);
		vfloat4 prod_yp = dot(sum_yp, sum_yp);
		vfloat4 prod_zp = dot(sum_zp, sum_zp);
		vfloat4 prod_wp = dot(sum_wp, sum_wp);

		vfloat4 best_vector = sum_xp;
		vfloat4 best_sum = prod_xp;

		vmask4 mask = prod_yp > best_sum;
		best_vector = select(best_vector, sum_yp, mask);
		best_sum = select(best_sum, prod_yp, mask);

		mask = prod_zp > best_sum;
		best_vector = select(best_vector, sum_zp, mask);
		best_sum = select(best_sum, prod_zp, mask);

		mask = prod_wp > best_sum;
		best_vector = select(best_vector, sum_wp, mask);

		pm[partition].dir = best_vector;
	}
}